

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_convolutiondepthwise_add(NetOptimize *this)

{
  int iVar1;
  uint _w;
  uint uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  Layer *pLVar8;
  long lVar9;
  long *plVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_88;
  Mat local_78;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar14 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_88 = 1;
  uVar16 = 0;
  while( true ) {
    if (uVar16 == uVar14) {
      return 0;
    }
    bVar11 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                             "ConvolutionDepthWise");
    if (!bVar11) break;
LAB_0012e7be:
    uVar16 = uVar16 + 1;
    local_88 = local_88 + 1;
  }
  iVar1 = *((((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar16]->tops).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar15 = local_88;
LAB_0012e7e2:
  if (uVar15 < uVar14) {
    bVar11 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar15]->type,"BinaryOp");
    if (((bVar11) ||
        (pLVar4 = (((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar15],
        piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)piVar5 != 8)) || (*piVar5 != iVar1))
    goto LAB_0012e823;
    if (uVar14 != uVar15) {
      ppLVar6 = (((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pLVar4 = ppLVar6[uVar15];
      if ((*(int *)&pLVar4[1]._vptr_Layer == 0) && (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)
         ) {
        pLVar7 = ppLVar6[uVar16];
        uVar13 = uVar15;
        if (uVar14 < uVar15) {
          uVar13 = uVar14;
        }
        uVar17 = 0;
        while ((uVar12 = uVar13, uVar13 != uVar17 &&
               ((bVar11 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                          "MemoryData"), bVar11 ||
                (uVar12 = uVar17,
                *((((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar17]->tops).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start !=
                *(int *)(*(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 4)))))) {
          uVar17 = uVar17 + 1;
        }
        if (uVar12 != uVar15) {
          pLVar8 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          _w = *(uint *)&pLVar7[1]._vptr_Layer;
          uVar15 = (ulong)_w;
          if ((*(uint *)&pLVar8[1]._vptr_Layer == _w) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 0)) {
            iVar1._0_1_ = pLVar8[1].support_bf16_storage;
            iVar1._1_1_ = pLVar8[1].support_fp16_storage;
            iVar1._2_1_ = pLVar8[1].support_int8_storage;
            iVar1._3_1_ = pLVar8[1].support_image_storage;
            bVar11 = iVar1 == 0;
          }
          else {
            bVar11 = false;
          }
          if ((*(uint *)&pLVar8[1]._vptr_Layer == 1) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 1)) {
            uVar2._0_1_ = pLVar8[1].support_bf16_storage;
            uVar2._1_1_ = pLVar8[1].support_fp16_storage;
            uVar2._2_1_ = pLVar8[1].support_int8_storage;
            uVar2._3_1_ = pLVar8[1].support_image_storage;
            if (uVar2 == _w || bVar11) {
LAB_0012e931:
              fprintf(_stderr,"fuse_convolutiondepthwise_add %s %s\n",
                      (pLVar7->name)._M_dataplus._M_p);
              ncnn::Mat::reshape(&local_78,(Mat *)&pLVar8[1].support_reserved_6,_w,(Allocator *)0x0)
              ;
              if (*(int *)&pLVar7[1].type._M_dataplus._M_p == 0) {
                *(undefined4 *)&pLVar7[1].type._M_dataplus._M_p = 1;
                if ((Mat *)&pLVar7[2].support_tensor_storage != &local_78) {
                  if (local_78.refcount != (int *)0x0) {
                    LOCK();
                    *local_78.refcount = *local_78.refcount + 1;
                    UNLOCK();
                  }
                  piVar5 = *(int **)&pLVar7[2].support_reserved_6;
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      plVar10 = (long *)pLVar7[2].type._M_dataplus._M_p;
                      if (plVar10 == (long *)0x0) {
                        free(*(void **)&pLVar7[2].support_tensor_storage);
                      }
                      else {
                        (**(code **)(*plVar10 + 0x18))();
                      }
                    }
                  }
                  *(void **)&pLVar7[2].support_tensor_storage = local_78.data;
                  *(int **)&pLVar7[2].support_reserved_6 = local_78.refcount;
                  pLVar7[2].userdata = (void *)local_78.elemsize;
                  pLVar7[2].typeindex = local_78.elempack;
                  pLVar7[2].type._M_dataplus._M_p = (pointer)local_78.allocator;
                  pLVar7[2].type._M_string_length = local_78._40_8_;
                  pLVar7[2].type.field_2._M_allocated_capacity = local_78._48_8_;
                  *(int *)((long)&pLVar7[2].type.field_2 + 8) = local_78.c;
                  pLVar7[2].name._M_dataplus._M_p = (pointer)local_78.cstep;
                }
              }
              else {
                lVar9 = *(long *)&pLVar7[2].support_tensor_storage;
                if ((int)_w < 1) {
                  uVar15 = 0;
                }
                for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                  *(float *)(lVar9 + uVar13 * 4) =
                       *(float *)(lVar9 + uVar13 * 4) + *(float *)((long)local_78.data + uVar13 * 4)
                  ;
                }
              }
              iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar1;
              (((this->super_ModelWriter).blobs)->
              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar1].producer = (int)uVar16;
              std::__cxx11::string::assign((char *)&pLVar4->type);
              if (local_78.refcount != (int *)0x0) {
                LOCK();
                *local_78.refcount = *local_78.refcount + -1;
                UNLOCK();
                if (*local_78.refcount == 0) {
                  if (local_78.allocator == (Allocator *)0x0) {
                    free(local_78.data);
                  }
                  else {
                    (*(local_78.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
          }
          else if (bVar11) goto LAB_0012e931;
        }
      }
    }
  }
  goto LAB_0012e7be;
LAB_0012e823:
  uVar15 = uVar15 + 1;
  goto LAB_0012e7e2;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_add %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = bias_data;
            }
            else
            {
                float* bias = convolutiondepthwise->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}